

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateCast(ExpressionContext *ctx,SynBase *source,ExprBase *value,TypeBase *type,
          bool isFunctionArgument)

{
  TypeBase *pTVar1;
  TypeStruct *type_00;
  TypeClass *target;
  ScopeData *pSVar2;
  char *pcVar3;
  char *pcVar4;
  Allocator *pAVar5;
  _func_int *p_Var6;
  FunctionData *pFVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  TypeUnsizedArray *type_01;
  undefined4 extraout_var;
  ExprBase *pEVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ExprError *pEVar13;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  VariableHandle *pVVar14;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  ExprFunctionAccess *this;
  TypeRef *pTVar15;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  FunctionData *pFVar16;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  _func_int **pp_Var17;
  ExprBase *pEVar18;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  ExprBase *pEVar19;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  SynBase *pSVar20;
  VariableData *pVVar21;
  ExprBase *pEVar22;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  ExprDereference *node;
  InplaceStr name;
  InplaceStr name_00;
  undefined8 in_stack_ffffffffffffff68;
  FunctionValue local_48;
  undefined4 extraout_var_00;
  undefined4 extraout_var_06;
  undefined4 extraout_var_14;
  undefined4 extraout_var_27;
  
  do {
    while( true ) {
      pTVar1 = (((ExprFunctionDefinition *)value)->super_ExprBase).type;
      if ((pTVar1 != (TypeBase *)0x0) && (pTVar1->typeID == 0)) goto LAB_001c1ac5;
      if ((((ExprFunctionDefinition *)value)->super_ExprBase).typeID != 0x24) break;
      value = CreateFunctionPointer(ctx,source,(ExprFunctionDefinition *)value,true);
    }
    if (pTVar1 == type) {
      AssertValueExpression(ctx,source,value);
      return &((ExprFunctionDefinition *)value)->super_ExprBase;
    }
    if ((type != (TypeBase *)0x0) && (type->typeID == 0x15)) {
      GetFunctionForType(&local_48,ctx,source,value,(TypeFunction *)type);
      if (local_48.function != (FunctionData *)0x0) {
        if (((local_48.context)->type != (TypeBase *)0x0) &&
           ((local_48.context)->type->typeID == 0x10)) {
          anon_unknown.dwarf_ff84f::Stop
                    (ctx,source,"ERROR: can\'t convert dynamic function set to \'%.*s\'",
                     (ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
        }
        iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        this = (ExprFunctionAccess *)CONCAT44(extraout_var_14,iVar11);
        ExprFunctionAccess::ExprFunctionAccess
                  (this,local_48.source,type,local_48.function,local_48.context);
        if (((((ExprFunctionDefinition *)value)->super_ExprBase).typeID & 0xfffffffe) != 0x24) {
          return &this->super_ExprBase;
        }
        pEVar22 = CreateSequence(ctx,source,value,(ExprBase *)this);
        return pEVar22;
      }
      pTVar1 = (((ExprFunctionDefinition *)value)->super_ExprBase).type;
      if (pTVar1->isGeneric == true) {
        pcVar3 = (pTVar1->name).begin;
        pcVar4 = (type->name).begin;
        anon_unknown.dwarf_ff84f::Stop
                  (ctx,source,"ERROR: can\'t resolve generic type \'%.*s\' instance for \'%.*s\'",
                   (ulong)(uint)(*(int *)&(pTVar1->name).end - (int)pcVar3),pcVar3,
                   (ulong)(uint)(*(int *)&(type->name).end - (int)pcVar4),pcVar4);
      }
    }
    bVar8 = AssertValueExpression(ctx,source,value);
    if (!bVar8) goto LAB_001c1ac5;
    type_00 = (TypeStruct *)(((ExprFunctionDefinition *)value)->super_ExprBase).type;
    bVar8 = ExpressionContext::IsNumericType(ctx,(TypeBase *)type_00);
    if ((bVar8) && (bVar8 = ExpressionContext::IsNumericType(ctx,type), bVar8)) {
      iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar22 = (ExprBase *)CONCAT44(extraout_var_08,iVar11);
      pEVar22->typeID = 0x12;
      pEVar22->source = source;
      pEVar22->type = type;
      pEVar22->next = (ExprBase *)0x0;
      pEVar22->listed = false;
      pEVar22->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
      pEVar22[1]._vptr_ExprBase = (_func_int **)value;
      pEVar22[1].typeID = 0;
      return pEVar22;
    }
    if ((type_00 != (TypeStruct *)0x0) && (ctx->typeBool == type)) {
      uVar9 = (type_00->super_TypeBase).typeID;
      if (uVar9 == 0x15) {
        iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar22 = (ExprBase *)CONCAT44(extraout_var_11,iVar11);
        pEVar22->typeID = 0x12;
        pEVar22->source = source;
        pEVar22->type = type;
        pEVar22->next = (ExprBase *)0x0;
        pEVar22->listed = false;
        pEVar22->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
        pEVar22[1]._vptr_ExprBase = (_func_int **)value;
        pEVar22[1].typeID = 3;
        return pEVar22;
      }
      if (uVar9 == 0x14) {
        iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar22 = (ExprBase *)CONCAT44(extraout_var_09,iVar11);
        pEVar22->typeID = 0x12;
        pEVar22->source = source;
        pEVar22->type = type;
        pEVar22->next = (ExprBase *)0x0;
        pEVar22->listed = false;
        pEVar22->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
        pEVar22[1]._vptr_ExprBase = (_func_int **)value;
        pEVar22[1].typeID = 2;
        return pEVar22;
      }
      if (uVar9 == 0x12) {
        iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar22 = (ExprBase *)CONCAT44(extraout_var_10,iVar11);
        pEVar22->typeID = 0x12;
        pEVar22->source = source;
        pEVar22->type = type;
        pEVar22->next = (ExprBase *)0x0;
        pEVar22->listed = false;
        pEVar22->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
        pEVar22[1]._vptr_ExprBase = (_func_int **)value;
        pEVar22[1].typeID = 1;
        return pEVar22;
      }
    }
    if (type_00 == (TypeStruct *)ctx->typeNullPtr) {
      if (type != (TypeBase *)0x0) {
        uVar9 = type->typeID;
        if (uVar9 == 0x12) {
          iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pEVar22 = (ExprBase *)CONCAT44(extraout_var_16,iVar11);
          pEVar22->typeID = 0x12;
          pEVar22->source = source;
          pEVar22->type = type;
          pEVar22->next = (ExprBase *)0x0;
          pEVar22->listed = false;
          pEVar22->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
          pEVar22[1]._vptr_ExprBase = (_func_int **)value;
          pEVar22[1].typeID = 4;
          return pEVar22;
        }
        if (ctx->typeAutoRef == (TypeStruct *)type) {
LAB_001c1da5:
          iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pEVar22 = (ExprBase *)CONCAT44(extraout_var_12,iVar11);
          pEVar22->typeID = 0x12;
          pEVar22->source = source;
          pEVar22->type = type;
          pEVar22->next = (ExprBase *)0x0;
          pEVar22->listed = false;
          pEVar22->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
          pEVar22[1]._vptr_ExprBase = (_func_int **)value;
          pEVar22[1].typeID = 5;
          return pEVar22;
        }
        if (uVar9 == 0x14) {
          iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pEVar22 = (ExprBase *)CONCAT44(extraout_var_17,iVar11);
          pEVar22->typeID = 0x12;
          pEVar22->source = source;
          pEVar22->type = type;
          pEVar22->next = (ExprBase *)0x0;
          pEVar22->listed = false;
          pEVar22->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
          pEVar22[1]._vptr_ExprBase = (_func_int **)value;
          pEVar22[1].typeID = 6;
          return pEVar22;
        }
        if (ctx->typeAutoArray == (TypeStruct *)type) {
LAB_001c1de7:
          iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pEVar22 = (ExprBase *)CONCAT44(extraout_var_13,iVar11);
          pEVar22->typeID = 0x12;
          pEVar22->source = source;
          pEVar22->type = type;
          pEVar22->next = (ExprBase *)0x0;
          pEVar22->listed = false;
          pEVar22->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
          pEVar22[1]._vptr_ExprBase = (_func_int **)value;
          pEVar22[1].typeID = 7;
          return pEVar22;
        }
        if (uVar9 == 0x15) {
          iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pEVar22 = (ExprBase *)CONCAT44(extraout_var_20,iVar11);
          pEVar22->typeID = 0x12;
          pEVar22->source = source;
          pEVar22->type = type;
          pEVar22->next = (ExprBase *)0x0;
          pEVar22->listed = false;
          pEVar22->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
          pEVar22[1]._vptr_ExprBase = (_func_int **)value;
          pEVar22[1].typeID = 8;
          return pEVar22;
        }
        goto LAB_001c1854;
      }
      if (ctx->typeAutoRef == (TypeStruct *)0x0) goto LAB_001c1da5;
      if (ctx->typeAutoArray == (TypeStruct *)0x0) goto LAB_001c1de7;
    }
    else if (type != (TypeBase *)0x0) {
      uVar9 = type->typeID;
LAB_001c1854:
      if (uVar9 == 0x14 && type_00 != (TypeStruct *)0x0) {
        if (((type_00->super_TypeBase).typeID == 0x13) &&
           (*(ScopeData **)&type[1].typeIndex == type_00->typeScope)) {
          uVar9 = (((ExprFunctionDefinition *)value)->super_ExprBase).typeID;
          if (uVar9 == 0x16) {
            iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            pEVar22 = (ExprBase *)CONCAT44(extraout_var_25,iVar11);
            pFVar16 = ((ExprFunctionDefinition *)value)->function;
            pEVar22->typeID = 0x12;
            pEVar22->source = source;
            pEVar22->type = type;
            pEVar22->next = (ExprBase *)0x0;
            pEVar22->listed = false;
            pEVar22->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
            pEVar22[1]._vptr_ExprBase = (_func_int **)pFVar16;
            pEVar22[1].typeID = 9;
            return pEVar22;
          }
          if (uVar9 == 0x22) {
            iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            pTVar15 = ExpressionContext::GetReferenceType
                                (ctx,(((ExprFunctionDefinition *)value)->super_ExprBase).type);
            iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
            pVVar14 = (VariableHandle *)CONCAT44(extraout_var_22,iVar10);
            pFVar16 = ((ExprFunctionDefinition *)value)->function;
            pVVar14->source = (((ExprFunctionDefinition *)value)->super_ExprBase).source;
            pVVar14->variable = (VariableData *)pFVar16;
            pVVar14->next = (VariableHandle *)0x0;
            pVVar14->listed = false;
            ExprGetAddress::ExprGetAddress
                      ((ExprGetAddress *)CONCAT44(extraout_var_21,iVar11),source,
                       &pTVar15->super_TypeBase,pVVar14);
            iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            pEVar22 = (ExprBase *)CONCAT44(extraout_var_23,iVar10);
            pEVar22->typeID = 0x12;
            pEVar22->source = source;
            pEVar22->type = type;
            pEVar22->next = (ExprBase *)0x0;
            pEVar22->listed = false;
            pEVar22->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
            pEVar22[1]._vptr_ExprBase = (_func_int **)CONCAT44(extraout_var_21,iVar11);
            pEVar22[1].typeID = 9;
            return pEVar22;
          }
          pSVar20 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
          pTVar15 = ExpressionContext::GetReferenceType(ctx,(TypeBase *)type_00);
          pVVar21 = anon_unknown.dwarf_ff84f::AllocateTemporary
                              (ctx,pSVar20,&pTVar15->super_TypeBase);
          pEVar22 = CreateObjectAllocation(ctx,pSVar20,(TypeBase *)type_00);
          iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pEVar12 = (ExprBase *)CONCAT44(extraout_var_26,iVar11);
          pTVar1 = ctx->typeVoid;
          iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
          pp_Var17 = (_func_int **)CONCAT44(extraout_var_27,iVar11);
          *pp_Var17 = (_func_int *)0x0;
          pp_Var17[1] = (_func_int *)pVVar21;
          pp_Var17[2] = (_func_int *)0x0;
          *(undefined1 *)(pp_Var17 + 3) = 0;
          pEVar18 = CreateVariableAccess(ctx,pSVar20,pVVar21,false);
          pEVar22 = CreateAssignment(ctx,pSVar20,pEVar18,pEVar22);
          pEVar12->typeID = 0x1e;
          pEVar12->source = pSVar20;
          pEVar12->type = pTVar1;
          pEVar12->next = (ExprBase *)0x0;
          pEVar12->listed = false;
          pEVar12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e34e8;
          pEVar12[1]._vptr_ExprBase = pp_Var17;
          *(ExprBase **)&pEVar12[1].typeID = pEVar22;
          iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar22 = (ExprBase *)CONCAT44(extraout_var_28,iVar11);
          pEVar18 = CreateVariableAccess(ctx,pSVar20,pVVar21,false);
          pEVar22->typeID = 0x16;
          pEVar22->source = pSVar20;
          pEVar22->type = (TypeBase *)type_00;
          pEVar22->next = (ExprBase *)0x0;
          pEVar22->listed = false;
          pEVar22->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3520;
          pEVar22[1]._vptr_ExprBase = (_func_int **)pEVar18;
          pEVar22 = CreateAssignment(ctx,pSVar20,pEVar22,value);
          iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pEVar18 = (ExprBase *)CONCAT44(extraout_var_29,iVar11);
          pEVar19 = CreateVariableAccess(ctx,pSVar20,pVVar21,false);
          pEVar18->typeID = 0x12;
          pEVar18->source = pSVar20;
          pEVar18->type = type;
          pEVar18->next = (ExprBase *)0x0;
          pEVar18->listed = false;
          pEVar18->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
          pEVar18[1]._vptr_ExprBase = (_func_int **)pEVar19;
          pEVar18[1].typeID = 9;
          pEVar22 = CreateSequence(ctx,source,pEVar12,pEVar22,pEVar18);
          return pEVar22;
        }
      }
      else if (uVar9 == 0x12) {
        if ((type_00 == (TypeStruct *)0x0) || ((type_00->super_TypeBase).typeID != 0x12)) {
          if (type_00 == ctx->typeAutoRef) {
            iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            pEVar22 = (ExprBase *)CONCAT44(extraout_var_24,iVar11);
            pEVar22->typeID = 0x12;
            pEVar22->source = source;
            pEVar22->type = type;
            pEVar22->next = (ExprBase *)0x0;
            pEVar22->listed = false;
            pEVar22->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
            pEVar22[1]._vptr_ExprBase = (_func_int **)value;
            pEVar22[1].typeID = 0xb;
            return pEVar22;
          }
          if (((isFunctionArgument & 1U) != 0) && (type_00 == (TypeStruct *)type[1]._vptr_TypeBase))
          {
            uVar9 = (((ExprFunctionDefinition *)value)->super_ExprBase).typeID;
            if (uVar9 == 0x16) {
              return (ExprBase *)((ExprFunctionDefinition *)value)->function;
            }
            if (uVar9 == 0x22) {
              iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              pTVar15 = ExpressionContext::GetReferenceType
                                  (ctx,(((ExprFunctionDefinition *)value)->super_ExprBase).type);
              iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
              pVVar14 = (VariableHandle *)CONCAT44(extraout_var_31,iVar10);
              pFVar16 = ((ExprFunctionDefinition *)value)->function;
              pVVar14->source = (((ExprFunctionDefinition *)value)->super_ExprBase).source;
              pVVar14->variable = (VariableData *)pFVar16;
              pVVar14->next = (VariableHandle *)0x0;
              pVVar14->listed = false;
              ExprGetAddress::ExprGetAddress
                        ((ExprGetAddress *)CONCAT44(extraout_var_30,iVar11),source,
                         &pTVar15->super_TypeBase,pVVar14);
              return &((ExprGetAddress *)CONCAT44(extraout_var_30,iVar11))->super_ExprBase;
            }
            pSVar20 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
            pVVar21 = anon_unknown.dwarf_ff84f::AllocateTemporary
                                (ctx,pSVar20,(TypeBase *)type[1]._vptr_TypeBase);
            iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            pTVar1 = pVVar21->type;
            pEVar22 = CreateVariableAccess(ctx,pSVar20,pVVar21,false);
            pEVar22 = CreateGetAddress(ctx,pSVar20,pEVar22);
            ExprAssignment::ExprAssignment
                      ((ExprAssignment *)CONCAT44(extraout_var_32,iVar11),pSVar20,pTVar1,pEVar22,
                       value);
            iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            pEVar12 = (ExprBase *)CONCAT44(extraout_var_33,iVar10);
            pTVar1 = ctx->typeVoid;
            iVar10 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
            pp_Var17 = (_func_int **)CONCAT44(extraout_var_34,iVar10);
            *pp_Var17 = (_func_int *)0x0;
            pp_Var17[1] = (_func_int *)pVVar21;
            pp_Var17[2] = (_func_int *)0x0;
            *(undefined1 *)(pp_Var17 + 3) = 0;
            pEVar12->typeID = 0x1e;
            pEVar12->source = pSVar20;
            pEVar12->type = pTVar1;
            pEVar12->next = (ExprBase *)0x0;
            pEVar12->listed = false;
            pEVar12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e34e8;
            pEVar12[1]._vptr_ExprBase = pp_Var17;
            *(ExprAssignment **)&pEVar12[1].typeID =
                 (ExprAssignment *)CONCAT44(extraout_var_32,iVar11);
            pEVar22 = CreateVariableAccess(ctx,pSVar20,pVVar21,false);
LAB_001c24fe:
            pEVar22 = CreateGetAddress(ctx,pSVar20,pEVar22);
            pEVar22 = CreateSequence(ctx,source,pEVar12,pEVar22);
            return pEVar22;
          }
        }
        else {
          target = (TypeClass *)type[1]._vptr_TypeBase;
          if (target != (TypeClass *)0x0) {
            uVar9 = (target->super_TypeStruct).super_TypeBase.typeID;
            if (uVar9 == 0x18) {
              pSVar2 = type_00->typeScope;
              if ((pSVar2 != (ScopeData *)0x0) && (pSVar2->uniqueId == 0x18)) {
                bVar8 = anon_unknown.dwarf_ff84f::IsDerivedFrom((TypeClass *)pSVar2,target);
                if (bVar8) {
LAB_001c1ac5:
                  iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
                  pEVar22 = (ExprBase *)CONCAT44(extraout_var_02,iVar11);
                  pEVar22->typeID = 0x12;
                  pEVar22->source = source;
                  pEVar22->type = type;
                  pEVar22->next = (ExprBase *)0x0;
                  pEVar22->listed = false;
                  pEVar22->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
                  pEVar22[1]._vptr_ExprBase = (_func_int **)value;
                  pEVar22[1].typeID = 0xd;
                  return pEVar22;
                }
                bVar8 = anon_unknown.dwarf_ff84f::IsDerivedFrom(target,(TypeClass *)pSVar2);
                if (bVar8) {
                  iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
                  pEVar22 = (ExprBase *)CONCAT44(extraout_var,iVar11);
                  pTVar15 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
                  pEVar22->typeID = 0x12;
                  pEVar22->source = source;
                  pEVar22->type = &pTVar15->super_TypeBase;
                  pEVar22->next = (ExprBase *)0x0;
                  pEVar22->listed = false;
                  pEVar22->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
                  pEVar22[1]._vptr_ExprBase = (_func_int **)value;
                  pEVar22[1].typeID = 0xd;
                  iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
                  pEVar12 = (ExprBase *)CONCAT44(extraout_var_00,iVar11);
                  pTVar1 = ctx->typeTypeID;
                  pEVar12->typeID = 8;
                  pEVar12->source = source;
                  pEVar12->type = pTVar1;
                  pEVar12->next = (ExprBase *)0x0;
                  pEVar12->listed = false;
                  pEVar12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3558;
                  pEVar12[1]._vptr_ExprBase = (_func_int **)target;
                  name.end = "";
                  name.begin = "__assert_derived_from";
                  pEVar22 = CreateFunctionCall2(ctx,source,name,pEVar22,pEVar12,false,false,true);
                  iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
                  pEVar12 = (ExprBase *)CONCAT44(extraout_var_01,iVar11);
                  pEVar12->typeID = 0x12;
                  pEVar12->source = source;
                  pEVar12->type = type;
                  pEVar12->next = (ExprBase *)0x0;
                  pEVar12->listed = false;
                  pEVar12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
                  pEVar12[1]._vptr_ExprBase = (_func_int **)pEVar22;
                  pEVar12[1].typeID = 0xd;
                  return pEVar12;
                }
              }
            }
            else if ((((uVar9 == 0x14) && (pSVar2 = type_00->typeScope, pSVar2 != (ScopeData *)0x0))
                     && (pSVar2->uniqueId == 0x13)) &&
                    ((TypeBase *)(target->identifier).super_SynBase._vptr_SynBase ==
                     (pSVar2->types).little[1])) {
              pSVar20 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
              pVVar21 = anon_unknown.dwarf_ff84f::AllocateTemporary(ctx,pSVar20,(TypeBase *)target);
              pEVar22 = CreateVariableAccess(ctx,pSVar20,pVVar21,false);
              iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
              pEVar12 = (ExprBase *)CONCAT44(extraout_var_35,iVar11);
              pEVar12->typeID = 0x12;
              pEVar12->source = pSVar20;
              pEVar12->type = (TypeBase *)target;
              pEVar12->next = (ExprBase *)0x0;
              pEVar12->listed = false;
              pEVar12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
              pEVar12[1]._vptr_ExprBase = (_func_int **)value;
              pEVar12[1].typeID = 9;
              pEVar22 = CreateAssignment(ctx,pSVar20,pEVar22,pEVar12);
              iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
              pEVar12 = (ExprBase *)CONCAT44(extraout_var_36,iVar11);
              pTVar1 = ctx->typeVoid;
              iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
              pp_Var17 = (_func_int **)CONCAT44(extraout_var_37,iVar11);
              *pp_Var17 = (_func_int *)0x0;
              pp_Var17[1] = (_func_int *)pVVar21;
              pp_Var17[2] = (_func_int *)0x0;
              *(undefined1 *)(pp_Var17 + 3) = 0;
              pEVar12->typeID = 0x1e;
              pEVar12->source = pSVar20;
              pEVar12->type = pTVar1;
              pEVar12->next = (ExprBase *)0x0;
              pEVar12->listed = false;
              pEVar12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e34e8;
              pEVar12[1]._vptr_ExprBase = pp_Var17;
              *(ExprBase **)&pEVar12[1].typeID = pEVar22;
              pEVar22 = CreateVariableAccess(ctx,pSVar20,pVVar21,false);
              goto LAB_001c24fe;
            }
          }
        }
      }
    }
    if ((ctx->typeAutoRef == (TypeStruct *)type) && (type_00 != (TypeStruct *)ctx->typeVoid)) {
      if ((type_00 != (TypeStruct *)0x0) && ((type_00->super_TypeBase).typeID == 0x12)) {
        iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar22 = (ExprBase *)CONCAT44(extraout_var_04,iVar11);
        pEVar22->typeID = 0x12;
        pEVar22->source = source;
        pEVar22->type = type;
        pEVar22->next = (ExprBase *)0x0;
        pEVar22->listed = false;
        pEVar22->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
        pEVar22[1]._vptr_ExprBase = (_func_int **)value;
        pEVar22[1].typeID = 10;
        return pEVar22;
      }
      uVar9 = (((ExprFunctionDefinition *)value)->super_ExprBase).typeID;
      pAVar5 = ctx->allocator;
      p_Var6 = pAVar5->_vptr_Allocator[2];
      if (uVar9 == 0x16) {
        iVar11 = (*p_Var6)(pAVar5,0x40);
        pEVar22 = (ExprBase *)CONCAT44(extraout_var_18,iVar11);
        pFVar16 = ((ExprFunctionDefinition *)value)->function;
      }
      else if (uVar9 == 0x22) {
        iVar11 = (*p_Var6)(pAVar5,0x38);
        pFVar16 = (FunctionData *)CONCAT44(extraout_var_05,iVar11);
        pTVar15 = ExpressionContext::GetReferenceType
                            (ctx,(((ExprFunctionDefinition *)value)->super_ExprBase).type);
        iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pVVar14 = (VariableHandle *)CONCAT44(extraout_var_06,iVar11);
        pFVar7 = ((ExprFunctionDefinition *)value)->function;
        pVVar14->source = (((ExprFunctionDefinition *)value)->super_ExprBase).source;
        pVVar14->variable = (VariableData *)pFVar7;
        pVVar14->next = (VariableHandle *)0x0;
        pVVar14->listed = false;
        ExprGetAddress::ExprGetAddress
                  ((ExprGetAddress *)pFVar16,source,&pTVar15->super_TypeBase,pVVar14);
        iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar22 = (ExprBase *)CONCAT44(extraout_var_07,iVar11);
      }
      else {
        iVar11 = (*p_Var6)(pAVar5,0x40);
        pEVar22 = (ExprBase *)CONCAT44(extraout_var_19,iVar11);
        pTVar15 = ExpressionContext::GetReferenceType
                            (ctx,(((ExprFunctionDefinition *)value)->super_ExprBase).type);
        pFVar16 = (FunctionData *)CreateCast(ctx,source,value,&pTVar15->super_TypeBase,true);
      }
      pEVar22->typeID = 0x12;
      pEVar22->source = source;
      pEVar22->type = type;
      pEVar22->next = (ExprBase *)0x0;
      pEVar22->listed = false;
      pEVar22->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
      pEVar22[1]._vptr_ExprBase = (_func_int **)pFVar16;
      pEVar22[1].typeID = 10;
      if ((isFunctionArgument & 1U) != 0) {
        return pEVar22;
      }
      name_00.end = "";
      name_00.begin = "duplicate";
      pEVar22 = CreateFunctionCall1(ctx,source,name_00,pEVar22,false,false,true);
      return pEVar22;
    }
    if ((ctx->typeAutoArray != (TypeStruct *)type) || (type_00 == (TypeStruct *)0x0))
    goto LAB_001c1b5b;
    uVar9 = (type_00->super_TypeBase).typeID;
    if (uVar9 != 0x13) {
      if (uVar9 == 0x14) {
        iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar13 = (ExprError *)CONCAT44(extraout_var_03,iVar11);
        (pEVar13->super_ExprBase).typeID = 0x12;
        (pEVar13->super_ExprBase).source = source;
        (pEVar13->super_ExprBase).type = type;
        (pEVar13->super_ExprBase).next = (ExprBase *)0x0;
        (pEVar13->super_ExprBase).listed = false;
        (pEVar13->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3478;
        (pEVar13->values).data = (ExprBase **)value;
        (pEVar13->values).count = 0xc;
      }
      else {
LAB_001c1b5b:
        if (type_00 == ctx->typeAutoRef) {
          if (type == (TypeBase *)0x0) {
            bVar8 = false;
          }
          else {
            bVar8 = type->typeID == 0x12;
          }
          if ((!bVar8) && (ctx->typeVoid != type)) {
            pTVar15 = ExpressionContext::GetReferenceType(ctx,type);
            pEVar22 = CreateCast(ctx,source,value,&pTVar15->super_TypeBase,false);
            iVar11 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
            pEVar12 = (ExprBase *)CONCAT44(extraout_var_15,iVar11);
            pEVar12->typeID = 0x16;
            pEVar12->source = source;
            pEVar12->type = type;
            pEVar12->next = (ExprBase *)0x0;
            pEVar12->listed = false;
            pEVar12->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3520;
            pEVar12[1]._vptr_ExprBase = (_func_int **)pEVar22;
            return pEVar12;
          }
        }
        pcVar3 = (type_00->super_TypeBase).name.begin;
        pcVar4 = (type->name).begin;
        pEVar13 = anon_unknown.dwarf_ff84f::ReportExpected
                            (ctx,source,type,"ERROR: cannot convert \'%.*s\' to \'%.*s\'",
                             (ulong)(uint)(*(int *)&(type_00->super_TypeBase).name.end - (int)pcVar3
                                          ),pcVar3,
                             CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                                      *(int *)&(type->name).end - (int)pcVar4),pcVar4);
      }
      return &pEVar13->super_ExprBase;
    }
    type_01 = ExpressionContext::GetUnsizedArrayType(ctx,(TypeBase *)type_00->typeScope);
    isFunctionArgument = false;
    value = CreateCast(ctx,source,value,(TypeBase *)type_01,false);
  } while( true );
}

Assistant:

ExprBase* CreateCast(ExpressionContext &ctx, SynBase *source, ExprBase *value, TypeBase *type, bool isFunctionArgument)
{
	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_REINTERPRET);

	// When function is used as value, hide its visibility immediately after use
	if(ExprFunctionDefinition *definition = getType<ExprFunctionDefinition>(value))
		return CreateCast(ctx, source, CreateFunctionPointer(ctx, source, definition, true), type, isFunctionArgument);

	if(value->type == type)
	{
		AssertValueExpression(ctx, source, value);

		return value;
	}

	if(TypeFunction *target = getType<TypeFunction>(type))
	{
		if(FunctionValue function = GetFunctionForType(ctx, source, value, target))
		{
			if(isType<TypeAutoRef>(function.context->type))
				Stop(ctx, source, "ERROR: can't convert dynamic function set to '%.*s'", FMT_ISTR(type->name));

			ExprBase *access = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(function.source, type, function.function, function.context);

			if(isType<ExprFunctionDefinition>(value) || isType<ExprGenericFunctionPrototype>(value))
				return CreateSequence(ctx, source, value, access);

			return access;
		}

		if(value->type->isGeneric)
			Stop(ctx, source, "ERROR: can't resolve generic type '%.*s' instance for '%.*s'", FMT_ISTR(value->type->name), FMT_ISTR(type->name));
	}

	if(!AssertValueExpression(ctx, source, value))
		return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_REINTERPRET);

	if(ctx.IsNumericType(value->type) && ctx.IsNumericType(type))
		return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_NUMERICAL);

	if(type == ctx.typeBool)
	{
		if(isType<TypeRef>(value->type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_PTR_TO_BOOL);

		if(isType<TypeUnsizedArray>(value->type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_UNSIZED_TO_BOOL);

		if(isType<TypeFunction>(value->type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_FUNCTION_TO_BOOL);
	}

	if(value->type == ctx.typeNullPtr)
	{
		// nullptr to type ref conversion
		if(isType<TypeRef>(type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_NULL_TO_PTR);

		// nullptr to auto ref conversion
		if(type == ctx.typeAutoRef)
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_NULL_TO_AUTO_PTR);

		// nullptr to type[] conversion
		if(isType<TypeUnsizedArray>(type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_NULL_TO_UNSIZED);

		// nullptr to auto[] conversion
		if(type == ctx.typeAutoArray)
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_NULL_TO_AUTO_ARRAY);

		// nullptr to function type conversion
		if(isType<TypeFunction>(type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_NULL_TO_FUNCTION);
	}

	if(TypeUnsizedArray *target = getType<TypeUnsizedArray>(type))
	{
		// type[N] to type[] conversion
		if(TypeArray *valueType = getType<TypeArray>(value->type))
		{
			if(target->subType == valueType->subType)
			{
				if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
				{
					ExprBase *address = new (ctx.get<ExprGetAddress>()) ExprGetAddress(source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));

					return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, address, EXPR_CAST_ARRAY_PTR_TO_UNSIZED);
				}
				else if(ExprDereference *node = getType<ExprDereference>(value))
				{
					return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, node->value, EXPR_CAST_ARRAY_PTR_TO_UNSIZED);
				}

				// Allocate storage in heap and copy literal data into it
				SynBase *sourceInternal = ctx.MakeInternal(source);

				VariableData *storage = AllocateTemporary(ctx, sourceInternal, ctx.GetReferenceType(valueType));

				ExprBase *alloc = CreateObjectAllocation(ctx, sourceInternal, valueType);

				ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false), alloc));

				ExprBase *assignment = CreateAssignment(ctx, sourceInternal, new (ctx.get<ExprDereference>()) ExprDereference(sourceInternal, valueType, CreateVariableAccess(ctx, sourceInternal, storage, false)), value);

				ExprBase *result = new (ctx.get<ExprTypeCast>()) ExprTypeCast(sourceInternal, type, CreateVariableAccess(ctx, sourceInternal, storage, false), EXPR_CAST_ARRAY_PTR_TO_UNSIZED);

				return CreateSequence(ctx, source, definition, assignment, result);
			}
		}
	}

	if(TypeRef *target = getType<TypeRef>(type))
	{
		if(TypeRef *valueType = getType<TypeRef>(value->type))
		{
			// type[N] ref to type[] ref conversion
			if(isType<TypeUnsizedArray>(target->subType) && isType<TypeArray>(valueType->subType))
			{
				TypeUnsizedArray *targetSub = getType<TypeUnsizedArray>(target->subType);
				TypeArray *sourceSub = getType<TypeArray>(valueType->subType);

				if(targetSub->subType == sourceSub->subType)
				{
					SynBase *sourceInternal = ctx.MakeInternal(source);

					VariableData *storage = AllocateTemporary(ctx, sourceInternal, targetSub);

					ExprBase *assignment = CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false), new (ctx.get<ExprTypeCast>()) ExprTypeCast(sourceInternal, targetSub, value, EXPR_CAST_ARRAY_PTR_TO_UNSIZED));

					ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

					ExprBase *result = CreateGetAddress(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false));

					return CreateSequence(ctx, source, definition, result);
				}
			}

			if(isType<TypeClass>(target->subType) && isType<TypeClass>(valueType->subType))
			{
				TypeClass *targetClass = getType<TypeClass>(target->subType);
				TypeClass *valueClass = getType<TypeClass>(valueType->subType);

				if(IsDerivedFrom(valueClass, targetClass))
					return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_REINTERPRET);

				if(IsDerivedFrom(targetClass, valueClass))
				{
					ExprBase *untyped = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, ctx.GetReferenceType(ctx.typeVoid), value, EXPR_CAST_REINTERPRET);
					ExprBase *typeID = new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, targetClass);

					ExprBase *checked = CreateFunctionCall2(ctx, source, InplaceStr("__assert_derived_from"), untyped, typeID, false, false, true);

					return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, checked, EXPR_CAST_REINTERPRET);
				}
			}
		}
		else if(value->type == ctx.typeAutoRef)
		{
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_AUTO_PTR_TO_PTR);
		}
		else if(isFunctionArgument && value->type == target->subType)
		{
			// type to type ref conversion
			if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
			{
				ExprBase *address = new (ctx.get<ExprGetAddress>()) ExprGetAddress(source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));

				return address;
			}
			else if(ExprDereference *node = getType<ExprDereference>(value))
			{
				return node->value;
			}
			else if(target->subType == value->type)
			{
				SynBase *sourceInternal = ctx.MakeInternal(source);

				VariableData *storage = AllocateTemporary(ctx, sourceInternal, target->subType);

				ExprBase *assignment = new (ctx.get<ExprAssignment>()) ExprAssignment(sourceInternal, storage->type, CreateGetAddress(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false)), value);

				ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

				ExprBase *result = CreateGetAddress(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false));

				return CreateSequence(ctx, source, definition, result);
			}
		}
	}

	if(type == ctx.typeAutoRef && value->type != ctx.typeVoid)
	{
		// type ref to auto ref conversion
		if(isType<TypeRef>(value->type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_PTR_TO_AUTO_PTR);

		ExprTypeCast *typeCast = NULL;

		// type to auto ref conversion
		if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
		{
			ExprBase *address = new (ctx.get<ExprGetAddress>()) ExprGetAddress(source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));

			typeCast = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, address, EXPR_CAST_PTR_TO_AUTO_PTR);
		}
		else if(ExprDereference *node = getType<ExprDereference>(value))
		{
			typeCast = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, node->value, EXPR_CAST_PTR_TO_AUTO_PTR);
		}
		else
		{
			typeCast = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, CreateCast(ctx, source, value, ctx.GetReferenceType(value->type), true), EXPR_CAST_PTR_TO_AUTO_PTR);
		}

		if(isFunctionArgument)
			return typeCast;

		// type to auto ref conversion (boxing)
		return CreateFunctionCall1(ctx, source, InplaceStr("duplicate"), typeCast, false, false, true);
	}

	if(type == ctx.typeAutoArray)
	{
		// type[] to auto[] conversion
		if(isType<TypeUnsizedArray>(value->type))
			return new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, type, value, EXPR_CAST_UNSIZED_TO_AUTO_ARRAY);
		
		if(TypeArray *valueType = getType<TypeArray>(value->type))
		{
			ExprBase *unsized = CreateCast(ctx, source, value, ctx.GetUnsizedArrayType(valueType->subType), false);

			return CreateCast(ctx, source, unsized, type, false);
		}
	}

	if(value->type == ctx.typeAutoRef)
	{
		// auto ref to type (unboxing)
		if(!isType<TypeRef>(type) && type != ctx.typeVoid)
		{
			ExprBase *ptr = CreateCast(ctx, source, value, ctx.GetReferenceType(type), false);

			return new (ctx.get<ExprDereference>()) ExprDereference(source, type, ptr);
		}
	}

	return ReportExpected(ctx, source, type, "ERROR: cannot convert '%.*s' to '%.*s'", FMT_ISTR(value->type->name), FMT_ISTR(type->name));
}